

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testSetData(tst_InsertProxyModel *this)

{
  uint uVar1;
  QObject *parent;
  bool bVar2;
  char cVar3;
  int iVar4;
  undefined8 *puVar5;
  uint *puVar6;
  ModelTest *this_00;
  anon_union_24_3_e3d07ef4_for_data local_a8;
  InsertProxyModel proxyModel;
  QArrayDataPointer<char16_t> local_68;
  QString idxData;
  QModelIndex proxyIdX;
  
  iVar4 = qMetaTypeId<QAbstractItemModel*>();
  puVar5 = (undefined8 *)QTest::qData("baseModel",iVar4);
  parent = (QObject *)*puVar5;
  if (parent != (QObject *)0x0) {
    puVar6 = (uint *)QTest::qData("idxRow",2);
    uVar1 = *puVar6;
    QTest::qData("idxCol",2);
    InsertProxyModel::InsertProxyModel(&proxyModel,(QObject *)0x0);
    this_00 = (ModelTest *)operator_new(0x10);
    ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,parent);
    InsertProxyModel::setMergeDisplayEdit(SUB81(&proxyModel,0));
    local_a8._0_4_ = 3;
    InsertProxyModel::setInsertDirection(&proxyModel);
    InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
    local_a8._forAlignment = -NAN;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = 0;
    InsertProxyModel::index((int)&proxyIdX,(int)&proxyModel,(QModelIndex *)(ulong)uVar1);
    idxData.d.d = (Data *)0x0;
    idxData.d.ptr = L"Test";
    idxData.d.size = 4;
    local_a8.shared = (PrivateShared *)0x0;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = 0;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
    QVariant::QVariant((QVariant *)&local_a8,(QString *)&idxData);
    bVar2 = (bool)InsertProxyModel::setData
                            ((QModelIndex *)&proxyModel,(QVariant *)&proxyIdX,(int)&local_a8);
    cVar3 = QTest::qVerify(bVar2,"proxyModel.setData(proxyIdX, idxData, Qt::DisplayRole)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x2d8);
    QVariant::~QVariant((QVariant *)&local_a8);
    if (cVar3 != '\0') {
      InsertProxyModel::data((QModelIndex *)&local_a8,(int)&proxyModel);
      QVariant::toString();
      bVar2 = QTest::qCompare((QString *)&local_68,&idxData,
                              "proxyModel.data(proxyIdX, Qt::DisplayRole).toString()","idxData",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                              ,0x2d9);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
      QVariant::~QVariant((QVariant *)&local_a8);
      if (bVar2) {
        InsertProxyModel::data((QModelIndex *)&local_a8,(int)&proxyModel);
        QVariant::toString();
        bVar2 = QTest::qCompare((QString *)&local_68,&idxData,
                                "proxyModel.data(proxyIdX, Qt::EditRole).toString()","idxData",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                ,0x2da);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QVariant::~QVariant((QVariant *)&local_a8);
        if (bVar2) {
          QObject::deleteLater();
        }
      }
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&idxData.d);
    InsertProxyModel::~InsertProxyModel(&proxyModel);
  }
  return;
}

Assistant:

void tst_InsertProxyModel::testSetData()
{
    QFETCH(QAbstractItemModel *, baseModel);
    if (!baseModel)
        return;
    QFETCH(int, idxRow);
    QFETCH(int, idxCol);
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setMergeDisplayEdit(true);
    proxyModel.setInsertDirection(InsertProxyModel::InsertColumn | InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(baseModel);
    const QModelIndex proxyIdX = proxyModel.index(idxRow, idxCol);
    const QString idxData = QStringLiteral("Test");
    QVERIFY(proxyModel.setData(proxyIdX, idxData, Qt::DisplayRole));
    QCOMPARE(proxyModel.data(proxyIdX, Qt::DisplayRole).toString(), idxData);
    QCOMPARE(proxyModel.data(proxyIdX, Qt::EditRole).toString(), idxData);
    baseModel->deleteLater();
}